

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

void deserialize_run_container_overlap(void)

{
  uint8_t data [19];
  
  data[0] = ';';
  data[1] = '0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\x01';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\x04';
  data[8] = '\0';
  data[9] = '\x02';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\x04';
  data[0xe] = '\0';
  data[0xf] = '\x01';
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  invalid_deserialize_test(data,0x13,"overlapping ranges");
  return;
}

Assistant:

DEFINE_TEST(deserialize_run_container_overlap) {
    // clang-format off
    const uint8_t data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0x01,       // Run Flag Bitset (single container is a run)
        0, 0,       // Upper 16 bits of the first container
        4, 0,       // Cardinality - 1 of the first container
        2, 0,       // First Container - Number of runs
        0, 0,       // First run start
        4, 0,       // First run length - 1
        1, 0,       // Second run start (STARTS INSIDE THE FIRST)
        0, 0,       // Second run length - 1
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "overlapping ranges");
}